

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageFederate::getMessage(MessageFederate *this)

{
  long *in_RSI;
  
  if (*(char *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 8) < '\x01') {
    this->_vptr_MessageFederate = (_func_int **)0x0;
  }
  else {
    MessageFederateManager::getMessage((MessageFederateManager *)this);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageFederate::getMessage()
{
    if (currentMode >= Modes::INITIALIZING) {
        return mfManager->getMessage();
    }
    return nullptr;
}